

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::quatd>(GeomPrimvar *this,quatd *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  uint32_t uVar6;
  quatd *pqVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar8;
  bool bVar9;
  string local_c8;
  undefined1 local_a8 [44];
  undefined1 local_7c [4];
  undefined1 local_78 [40];
  string local_50;
  
  if (dest == (quatd *)0x0) {
joined_r0x001b14f8:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar8 = false;
      }
      else {
        uVar6 = (*pvVar1->type_id)();
        bVar8 = uVar6 == 4;
      }
      if ((bVar8) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001b14f8;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar1->type_id)(), uVar6 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar9 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar8 = !bVar9;
        if (bVar9) {
          if (err == (string *)0x0) {
            return bVar8;
          }
          std::__cxx11::string::append((char *)err);
          return bVar8;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pqVar7 = tinyusdz::value::Value::as<tinyusdz::value::quatd>(&pSVar2->value,false);
        if (pqVar7 != (quatd *)0x0) {
          local_a8._7_4_ = *(undefined4 *)(pqVar7->imag)._M_elems;
          local_a8._11_4_ = *(undefined4 *)((long)(pqVar7->imag)._M_elems + 4);
          local_a8._15_4_ = *(undefined4 *)((pqVar7->imag)._M_elems + 1);
          local_a8._19_4_ = *(undefined4 *)((long)(pqVar7->imag)._M_elems + 0xc);
          local_a8._23_4_ = *(undefined4 *)((pqVar7->imag)._M_elems + 2);
          local_a8._27_4_ = *(undefined4 *)((long)(pqVar7->imag)._M_elems + 0x14);
          local_a8._31_4_ = *(undefined4 *)&pqVar7->real;
          local_a8._35_4_ = *(undefined4 *)((long)&pqVar7->real + 4);
          local_a8[0] = bVar8;
          goto LAB_001b1631;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar6 = Attribute::type_id(this_00);
      bVar8 = IsSupportedGeomPrimvarType(uVar6);
      if (bVar8) {
        primvar::PrimVar::get_value<tinyusdz::value::quatd>
                  ((optional<tinyusdz::value::quatd> *)local_a8,&(this->_attr)._var);
        if ((bool)local_a8[0] == true) {
          local_78[10] = local_a8[0xb];
          local_78._7_3_ = local_a8._8_3_;
          local_78[0xe] = local_a8[0xf];
          local_78._11_3_ = local_a8._12_3_;
          local_a8._15_4_ = CONCAT13(local_a8[0x13],local_a8._16_3_);
          local_a8._19_4_ = CONCAT13(local_a8[0x17],local_a8._20_3_);
          uVar4 = CONCAT17(local_a8[0x1f],CONCAT43(local_a8._27_4_,local_a8._24_3_));
          local_78._31_8_ = CONCAT17(local_a8[0x27],CONCAT43(local_a8._35_4_,local_a8._32_3_));
          local_78[0x17] = SUB41(local_a8._23_4_,1);
          local_78._24_7_ = (undefined7)((ulong)uVar4 >> 8);
          local_a8._23_4_ = (undefined4)CONCAT43(local_a8._27_4_,local_a8._24_3_);
          local_a8._27_4_ = (undefined4)((ulong)uVar4 >> 0x20);
          local_a8._31_4_ = (undefined4)CONCAT43(local_a8._35_4_,local_a8._32_3_);
          local_a8._35_4_ = (undefined4)((ulong)local_78._31_8_ >> 0x20);
          local_a8._7_4_ = local_78._7_4_;
          local_a8._11_4_ = local_78._11_4_;
          local_78._15_4_ = local_a8._15_4_;
          local_78._19_4_ = local_a8._19_4_;
        }
        if ((bool)local_a8[0] == false) {
          if (err == (string *)0x0) {
            return false;
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_7c = (undefined1  [4])0x32;
          Attribute::type_name_abi_cxx11_(&local_50,this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)local_78,(fmt *)&local_c8,(string *)local_7c,(uint *)&local_50,in_R8)
          ;
          std::__cxx11::string::_M_append((char *)err,CONCAT17(local_78[7],local_78._0_7_));
          if ((undefined1 *)CONCAT17(local_78[7],local_78._0_7_) != local_78 + 0x10) {
            operator_delete((undefined1 *)CONCAT17(local_78[7],local_78._0_7_),
                            CONCAT17(local_78[0x17],CONCAT43(local_78._19_4_,local_78._16_3_)) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
            return false;
          }
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          return false;
        }
LAB_001b1631:
        *(undefined4 *)((dest->imag)._M_elems + 2) = local_a8._23_4_;
        *(undefined4 *)((long)(dest->imag)._M_elems + 0x14) = local_a8._27_4_;
        *(undefined4 *)&dest->real = local_a8._31_4_;
        *(undefined4 *)((long)&dest->real + 4) = local_a8._35_4_;
        *(undefined4 *)(dest->imag)._M_elems = local_a8._7_4_;
        *(undefined4 *)((long)(dest->imag)._M_elems + 4) = local_a8._11_4_;
        *(undefined4 *)((dest->imag)._M_elems + 1) = local_a8._15_4_;
        *(undefined4 *)((long)(dest->imag)._M_elems + 0xc) = local_a8._19_4_;
        return (bool)local_a8[0];
      }
      if (err != (string *)0x0) {
        puVar5 = local_78 + 0x10;
        local_78._0_7_ = SUB87(puVar5,0);
        local_78[7] = (undefined1)((ulong)puVar5 >> 0x38);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_(&local_c8,this_00);
        fmt::format<std::__cxx11::string>((string *)local_a8,(fmt *)local_78,&local_c8,in_RCX);
        std::__cxx11::string::_M_append
                  ((char *)err,CONCAT17(local_a8[7],CONCAT61(local_a8._1_6_,local_a8[0])));
        puVar3 = (undefined1 *)CONCAT17(local_a8[7],CONCAT61(local_a8._1_6_,local_a8[0]));
        if (puVar3 != local_a8 + 0x10) {
          operator_delete(puVar3,CONCAT17(local_a8[0x17],CONCAT43(local_a8._19_4_,local_a8._16_3_))
                                 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)CONCAT17(local_78[7],local_78._0_7_) != puVar5) {
          operator_delete((undefined1 *)CONCAT17(local_78[7],local_78._0_7_),
                          CONCAT17(local_78[0x17],CONCAT43(local_78._19_4_,local_78._16_3_)) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}